

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::getList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  unsigned_short uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  CapTableBuilder *capTable;
  word *pwVar7;
  ElementSize EVar8;
  WirePointer *pWVar9;
  SegmentBuilder *this_00;
  ulong uVar10;
  uint uVar11;
  WirePointer *pWVar12;
  Fault f;
  Fault local_48;
  SegmentBuilder *local_40;
  WirePointer *local_38;
  
  uVar11 = (uint)elementSize;
  local_38 = this->pointer;
  local_40 = this->segment;
  capTable = this->capTable;
  if ((local_38->field_1).upper32Bits == 0 && (local_38->offsetAndKind).value == 0)
  goto LAB_001fe886;
  pWVar9 = local_38 + (long)((int)(local_38->offsetAndKind).value >> 2) + 1;
  do {
    pWVar12 = local_38;
    this_00 = local_40;
    if (((local_38->offsetAndKind).value & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(local_40->super_SegmentReader).arena,
                           (SegmentId)(local_38->field_1).structRef);
      uVar5 = (pWVar12->offsetAndKind).value;
      pwVar7 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar5 & 0xfffffff8);
      pWVar1 = (WirePointer *)((long)&pwVar7->content + uVar10);
      pWVar12 = (WirePointer *)((long)&pwVar7[1].content + uVar10);
      if ((uVar5 & 4) == 0) {
        pWVar9 = pWVar12 + ((int)(pWVar1->offsetAndKind).value >> 2);
        pWVar12 = pWVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar1->field_1).structRef);
        pWVar9 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar1->offsetAndKind).value & 0xfffffff8));
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((pWVar12->offsetAndKind).value & 3) == 1) {
      uVar5 = (pWVar12->field_1).upper32Bits;
      EVar8 = (ElementSize)uVar5 & INLINE_COMPOSITE;
      if (EVar8 == INLINE_COMPOSITE) {
        uVar5 = (uint)*(uint64_t *)&(pWVar9->offsetAndKind).value;
        if ((uVar5 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x502,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&local_48);
        }
        pWVar12 = pWVar9 + 1;
        uVar2 = *(ushort *)&pWVar9->field_1;
        uVar3 = (pWVar9->field_1).structRef.ptrCount.value;
        if (uVar11 - 2 < 4) {
          if ((ulong)uVar2 != 0) goto LAB_001fe991;
          getList();
        }
        else if (uVar11 == 1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    (&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x510,FAILED,(char *)0x0,
                     "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])
                      "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault(&local_48);
        }
        else {
          if (uVar11 != 6) {
            if (uVar11 == 7) {
              kj::_::unreachable();
            }
LAB_001fe991:
            uVar4 = (pWVar9->field_1).structRef.ptrCount.value;
            __return_storage_ptr__->segment = this_00;
            __return_storage_ptr__->capTable = capTable;
            __return_storage_ptr__->ptr = (byte *)pWVar12;
            __return_storage_ptr__->elementCount = uVar5 >> 2 & 0x1fffffff;
            __return_storage_ptr__->step = ((uint)uVar4 + (uint)uVar2) * 0x40;
            __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
            __return_storage_ptr__->structPointerCount = uVar3;
            __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
            return __return_storage_ptr__;
          }
          if (uVar3 != 0) {
            pWVar12 = pWVar12 + uVar2;
            goto LAB_001fe991;
          }
          getList();
        }
      }
      else {
        uVar6 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar8 * 4);
        if (elementSize == BIT) {
          if (EVar8 == BIT) {
LAB_001fea0c:
            __return_storage_ptr__->segment = this_00;
            __return_storage_ptr__->capTable = capTable;
            __return_storage_ptr__->ptr = (byte *)pWVar9;
            __return_storage_ptr__->elementCount = uVar5 >> 3;
            __return_storage_ptr__->step = (uint)(EVar8 == POINTER) * 0x40 + uVar6;
            __return_storage_ptr__->structDataSize = uVar6;
            __return_storage_ptr__->structPointerCount = (ushort)(EVar8 == POINTER);
            __return_storage_ptr__->elementSize = EVar8;
            return __return_storage_ptr__;
          }
          getList();
        }
        else if (EVar8 == BIT) {
          getList();
        }
        else if (uVar6 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)uVar11 * 4)) {
          getList();
        }
        else {
          if ((elementSize != POINTER) || (EVar8 == POINTER)) goto LAB_001fea0c;
          getList();
        }
      }
    }
    else {
      getList();
    }
LAB_001fe886:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
      __return_storage_ptr__->elementSize = elementSize;
      return __return_storage_ptr__;
    }
    pWVar9 = (WirePointer *)
             WireHelpers::copyMessage(&local_40,capTable,&local_38,(WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getList(ElementSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableListPointer(pointer, segment, capTable, elementSize, defaultValue);
}